

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

void xmlBufferWriteQuotedString(xmlBufferPtr buf,xmlChar *string)

{
  xmlChar *pxVar1;
  long lVar2;
  char *str;
  
  if (buf == (xmlBufferPtr)0x0) {
    return;
  }
  pxVar1 = xmlStrchr(string,'\"');
  if (pxVar1 == (xmlChar *)0x0) {
    str = "\"";
  }
  else {
    pxVar1 = xmlStrchr(string,'\'');
    if (pxVar1 != (xmlChar *)0x0) {
      str = "\"";
      xmlBufferCCat(buf,"\"");
      do {
        lVar2 = 0;
        while( true ) {
          if (string[lVar2] == '\0') {
            if (lVar2 != 0) {
              xmlBufferAdd(buf,string,(int)lVar2);
            }
            goto LAB_001282c5;
          }
          if (string[lVar2] == '\"') break;
          lVar2 = lVar2 + 1;
        }
        if (lVar2 != 0) {
          xmlBufferAdd(buf,string,(int)lVar2);
        }
        xmlBufferAdd(buf,(xmlChar *)"&quot;",6);
        string = string + lVar2 + 1;
      } while( true );
    }
    str = "\'";
  }
  xmlBufferCCat(buf,str);
  xmlBufferCat(buf,string);
LAB_001282c5:
  xmlBufferCCat(buf,str);
  return;
}

Assistant:

void
xmlBufferWriteQuotedString(xmlBufferPtr buf, const xmlChar *string) {
    const xmlChar *cur, *base;
    if (buf == NULL)
        return;
    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
	    xmlBufferCCat(buf, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlBufferAdd(buf, base, cur - base);
                    xmlBufferAdd(buf, BAD_CAST "&quot;", 6);
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlBufferAdd(buf, base, cur - base);
	    xmlBufferCCat(buf, "\"");
	}
        else{
	    xmlBufferCCat(buf, "\'");
            xmlBufferCat(buf, string);
	    xmlBufferCCat(buf, "\'");
        }
    } else {
        xmlBufferCCat(buf, "\"");
        xmlBufferCat(buf, string);
        xmlBufferCCat(buf, "\"");
    }
}